

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

CheckpointDecision * __thiscall
duckdb::DuckTransactionManager::CanCheckpoint
          (CheckpointDecision *__return_storage_ptr__,DuckTransactionManager *this,
          DuckTransaction *transaction,
          unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
          *lock,UndoBufferProperties *undo_properties)

{
  pointer puVar1;
  _Alloc_hider __p;
  bool bVar2;
  StorageManager *this_00;
  DBConfig *pDVar3;
  type pDVar4;
  pointer pDVar5;
  CheckpointType type;
  string *this_01;
  pointer this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  string other_transactions;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = AttachedDatabase::IsSystem((this->super_TransactionManager).db);
  if (bVar2) {
    ::std::__cxx11::string::string
              ((string *)&local_f0,"system transaction",(allocator *)&other_transactions);
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_f0);
    this_01 = &local_f0;
LAB_015a22de:
    ::std::__cxx11::string::~string((string *)this_01);
    return __return_storage_ptr__;
  }
  this_00 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
  bVar2 = StorageManager::InMemory(this_00);
  if (bVar2) {
    ::std::__cxx11::string::string
              ((string *)&local_110,"in memory db",(allocator *)&other_transactions);
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_110);
    this_01 = &local_110;
    goto LAB_015a22de;
  }
  if (this_00->load_complete == false) {
    ::std::__cxx11::string::string
              ((string *)&local_130,"cannot checkpoint while loading",
               (allocator *)&other_transactions);
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_130);
    this_01 = &local_130;
    goto LAB_015a22de;
  }
  bVar2 = DuckTransaction::AutomaticCheckpoint
                    (transaction,(this->super_TransactionManager).db,undo_properties);
  if (!bVar2) {
    ::std::__cxx11::string::string
              ((string *)&local_150,"no reason to automatically checkpoint",
               (allocator *)&other_transactions);
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_150);
    this_01 = &local_150;
    goto LAB_015a22de;
  }
  pDVar3 = DBConfig::GetConfig(((this->super_TransactionManager).db)->db);
  if ((pDVar3->options).debug_skip_checkpoint_on_commit == true) {
    ::std::__cxx11::string::string
              ((string *)&local_170,"checkpointing on commit disabled through configuration",
               (allocator *)&other_transactions);
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_170);
    this_01 = &local_170;
    goto LAB_015a22de;
  }
  DuckTransaction::TryGetCheckpointLock((DuckTransaction *)&other_transactions);
  __p = other_transactions._M_dataplus;
  other_transactions._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        lock,(pointer)__p._M_p);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              &other_transactions);
  if ((lock->super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
      ._M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl == (StorageLockKey *)0x0)
  {
    ::std::__cxx11::string::string
              ((string *)&local_190,
               "Failed to obtain checkpoint lock - another thread is writing/checkpointing or another read transaction relies on data that is not yet committed"
               ,(allocator *)&other_transactions);
    CheckpointDecision::CheckpointDecision(__return_storage_ptr__,&local_190);
    this_01 = &local_190;
    goto LAB_015a22de;
  }
  if (((undo_properties->has_updates == false) && (undo_properties->has_deletes == false)) &&
     (type = FULL_CHECKPOINT, undo_properties->has_dropped_entries != true)) goto LAB_015a24ce;
  other_transactions._M_dataplus._M_p = (pointer)&other_transactions.field_2;
  other_transactions._M_string_length = 0;
  other_transactions.field_2._M_local_buf[0] = '\0';
  puVar1 = (this->active_transactions).
           super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->active_transactions).
                 super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1; this_02 = this_02 + 1
      ) {
    pDVar4 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
             ::operator*(this_02);
    if (pDVar4 != transaction) {
      if (other_transactions._M_string_length != 0) {
        ::std::__cxx11::string::append((char *)&other_transactions);
      }
      pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator->(this_02);
      ::std::__cxx11::to_string(&local_d0,pDVar5->transaction_id);
      ::std::operator+(&local_b0,"[",&local_d0);
      ::std::operator+(&local_50,&local_b0,"]");
      ::std::__cxx11::string::append((string *)&other_transactions);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  bVar2 = true;
  if (other_transactions._M_string_length == 0) {
LAB_015a24bb:
    type = FULL_CHECKPOINT;
  }
  else {
    if (undo_properties->has_dropped_entries == true) {
      __return_storage_ptr___00 = &local_70;
      ::std::operator+(__return_storage_ptr___00,
                       "Transaction has dropped catalog entries and there are other transactions active\nActive transactions: "
                       ,&other_transactions);
      CheckpointDecision::CheckpointDecision(__return_storage_ptr__,__return_storage_ptr___00);
LAB_015a24b0:
      ::std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      bVar2 = false;
      goto LAB_015a24bb;
    }
    if (undo_properties->has_updates == true) {
      __return_storage_ptr___00 = &local_90;
      ::std::operator+(__return_storage_ptr___00,
                       "Transaction has performed updates and there are other transactions active\nActive transactions: "
                       ,&other_transactions);
      CheckpointDecision::CheckpointDecision(__return_storage_ptr__,__return_storage_ptr___00);
      goto LAB_015a24b0;
    }
    type = CONCURRENT_CHECKPOINT;
  }
  ::std::__cxx11::string::~string((string *)&other_transactions);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
LAB_015a24ce:
  CheckpointDecision::CheckpointDecision(__return_storage_ptr__,type);
  return __return_storage_ptr__;
}

Assistant:

DuckTransactionManager::CheckpointDecision
DuckTransactionManager::CanCheckpoint(DuckTransaction &transaction, unique_ptr<StorageLockKey> &lock,
                                      const UndoBufferProperties &undo_properties) {
	if (db.IsSystem()) {
		return CheckpointDecision("system transaction");
	}
	auto &storage_manager = db.GetStorageManager();
	if (storage_manager.InMemory()) {
		return CheckpointDecision("in memory db");
	}
	if (!storage_manager.IsLoaded()) {
		return CheckpointDecision("cannot checkpoint while loading");
	}
	if (!transaction.AutomaticCheckpoint(db, undo_properties)) {
		return CheckpointDecision("no reason to automatically checkpoint");
	}
	auto &config = DBConfig::GetConfig(db.GetDatabase());
	if (config.options.debug_skip_checkpoint_on_commit) {
		return CheckpointDecision("checkpointing on commit disabled through configuration");
	}
	// try to lock the checkpoint lock
	lock = transaction.TryGetCheckpointLock();
	if (!lock) {
		return CheckpointDecision("Failed to obtain checkpoint lock - another thread is writing/checkpointing or "
		                          "another read transaction relies on data that is not yet committed");
	}
	auto checkpoint_type = CheckpointType::FULL_CHECKPOINT;
	if (undo_properties.has_updates || undo_properties.has_deletes || undo_properties.has_dropped_entries) {
		// if we have made updates/deletes/catalog changes in this transaction we might need to change our strategy
		// in the presence of other transactions
		string other_transactions;
		for (auto &active_transaction : active_transactions) {
			if (!RefersToSameObject(*active_transaction, transaction)) {
				if (!other_transactions.empty()) {
					other_transactions += ", ";
				}
				other_transactions += "[" + to_string(active_transaction->transaction_id) + "]";
			}
		}
		if (!other_transactions.empty()) {
			// there are other transactions!
			// these active transactions might need data from BEFORE this transaction
			// we might need to change our strategy here based on what changes THIS transaction has made
			if (undo_properties.has_dropped_entries) {
				// this transaction has changed the catalog - we cannot checkpoint
				return CheckpointDecision("Transaction has dropped catalog entries and there are other transactions "
				                          "active\nActive transactions: " +
				                          other_transactions);
			} else if (undo_properties.has_updates) {
				// this transaction has performed updates - we cannot checkpoint
				return CheckpointDecision(
				    "Transaction has performed updates and there are other transactions active\nActive transactions: " +
				    other_transactions);
			} else {
				// this transaction has performed deletes - we cannot vacuum - initiate a concurrent checkpoint instead
				D_ASSERT(undo_properties.has_deletes);
				checkpoint_type = CheckpointType::CONCURRENT_CHECKPOINT;
			}
		}
	}
	return CheckpointDecision(checkpoint_type);
}